

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

void __thiscall
vkt::SpirVAssembly::anon_unknown_5::SpecConstantTwoIntCase::SpecConstantTwoIntCase
          (SpecConstantTwoIntCase *this,char *name,char *definition0,char *definition1,
          char *resultType,char *operation,deInt32 value0,deInt32 value1,char *resultOp,
          vector<int,_std::allocator<int>_> *output)

{
  char *operation_local;
  char *resultType_local;
  char *definition1_local;
  char *definition0_local;
  char *name_local;
  SpecConstantTwoIntCase *this_local;
  
  this->caseName = name;
  this->scDefinition0 = definition0;
  this->scDefinition1 = definition1;
  this->scResultType = resultType;
  this->scOperation = operation;
  this->scActualValue0 = value0;
  this->scActualValue1 = value1;
  this->resultOperation = resultOp;
  std::vector<int,_std::allocator<int>_>::vector(&this->expectedOutput,output);
  return;
}

Assistant:

SpecConstantTwoIntCase (const char* name,
											const char* definition0,
											const char* definition1,
											const char* resultType,
											const char* operation,
											deInt32 value0,
											deInt32 value1,
											const char* resultOp,
											const vector<deInt32>& output)
						: caseName			(name)
						, scDefinition0		(definition0)
						, scDefinition1		(definition1)
						, scResultType		(resultType)
						, scOperation		(operation)
						, scActualValue0	(value0)
						, scActualValue1	(value1)
						, resultOperation	(resultOp)
						, expectedOutput	(output) {}